

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical
          (BayesianGameCollaborativeGraphical *this,BayesianGameCollaborativeGraphical *o)

{
  PDDiscreteInterface *pPVar1;
  BayesianGameIdenticalPayoff *this_00;
  long lVar2;
  ulong uVar3;
  pointer ppBVar4;
  uint uVar5;
  ulong uVar6;
  BayesianGameIdenticalPayoff *local_38;
  
  BayesianGameBase::BayesianGameBase((BayesianGameBase *)this,(BayesianGameBase *)o);
  (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameCollaborativeGraphical_005a1438;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_nrLRFs = o->_m_nrLRFs;
  if (o->_m_jt_pd != (PDDiscreteInterface *)0x0) {
    pPVar1 = (PDDiscreteInterface *)(**(code **)(*(long *)o->_m_jt_pd + 0x40))();
    this->_m_jt_pd = pPVar1;
  }
  ppBVar4 = (this->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_LRFs).
      super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppBVar4) {
    (this->_m_LRFs).
    super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppBVar4;
  }
  ppBVar4 = (o->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(o->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar4;
  if (lVar2 != 0) {
    uVar3 = lVar2 >> 3;
    uVar5 = 1;
    uVar6 = 0;
    do {
      this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
      if (uVar3 <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                   ,uVar3);
      }
      BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff(this_00,ppBVar4[uVar6]);
      local_38 = this_00;
      std::vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>>::
      emplace_back<BayesianGameIdenticalPayoff*>
                ((vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>>
                  *)&this->_m_LRFs,&local_38);
      uVar6 = (ulong)uVar5;
      ppBVar4 = (o->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(o->_m_LRFs).
                    super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar4 >> 3;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar6);
  }
  std::vector<Scope,_std::allocator<Scope>_>::operator=(&this->_m_agentScopes,&o->_m_agentScopes);
  return;
}

Assistant:

BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical(
    const BayesianGameCollaborativeGraphical& o) :
        BayesianGameIdenticalPayoffInterface(o)
{
    _m_nrLRFs = o._m_nrLRFs;
    if( o._m_jt_pd )
        _m_jt_pd = o._m_jt_pd->Clone();
    _m_LRFs.clear();
    for(Index i=0;i!=o._m_LRFs.size();++i)
        _m_LRFs.push_back(new BayesianGameIdenticalPayoff(*o._m_LRFs.at(i)));
    _m_agentScopes=o._m_agentScopes;
}